

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

bool __thiscall
crnd::crn_unpacker::unpack_dxt5a
          (crn_unpacker *this,uint8 **pDst,uint32 row_pitch_in_bytes,uint32 output_width,
          uint32 output_height)

{
  symbol_codec *this_00;
  vector<crnd::crn_unpacker::block_buffer_element> *this_01;
  uint uVar1;
  unsigned_short *puVar2;
  byte bVar3;
  uint32 uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  uint new_size;
  uint uVar10;
  uint uVar11;
  block_buffer_element *pbVar12;
  ulong uVar13;
  bool bVar14;
  uint8 *local_98;
  
  uVar1 = (this->m_alpha_endpoints).m_size;
  new_size = output_width + 1 & 0xfffffffe;
  this_01 = &this->m_block_buffer;
  if ((this->m_block_buffer).m_size < new_size) {
    vector<crnd::crn_unpacker::block_buffer_element>::resize(this_01,new_size);
  }
  this_00 = &this->m_codec;
  uVar6 = 0;
  uVar8 = 0;
  uVar11 = 0;
  do {
    if ((this->m_pHeader->m_faces).m_buf[0] <= uVar6) {
      return true;
    }
    local_98 = pDst[uVar6];
    for (uVar10 = 0; uVar10 != (output_height + 1 & 0xfffffffe); uVar10 = uVar10 + 1) {
      bVar14 = uVar10 < output_height;
      uVar5 = 0;
      uVar13 = 0;
      for (lVar9 = 0; uVar7 = (uint)uVar8, (ulong)(output_width + 1 & 0xfffffffe) << 3 != lVar9;
          lVar9 = lVar9 + 8) {
        if (((uVar10 | uVar5) & 1) == 0) {
          uVar4 = symbol_codec::decode(this_00,&this->m_reference_encoding_dm);
          uVar8 = (ulong)uVar4;
          pbVar12 = (block_buffer_element *)((long)&this_01->m_p->endpoint_reference + lVar9);
LAB_00111ec6:
          bVar3 = (byte)uVar8 & 3;
          pbVar12->endpoint_reference = (ushort)((byte)(uVar8 >> 2) & 3);
          uVar7 = (uint)(uVar8 >> 4) & 0xf;
        }
        else {
          if ((uVar10 & 1) == 0) {
            pbVar12 = this_01->m_p + uVar13;
            goto LAB_00111ec6;
          }
          pbVar12 = (block_buffer_element *)((long)&this_01->m_p->endpoint_reference + lVar9);
          bVar3 = (byte)pbVar12->endpoint_reference;
        }
        uVar8 = (ulong)uVar7;
        if (bVar3 == 1) {
          pbVar12->alpha0_endpoint_index = (uint16)uVar11;
        }
        else if (bVar3 == 0) {
          uVar4 = symbol_codec::decode(this_00,this->m_endpoint_delta_dm + 1);
          uVar7 = 0;
          if (uVar1 <= uVar4 + uVar11) {
            uVar7 = uVar1;
          }
          uVar11 = (uVar4 + uVar11) - uVar7;
          pbVar12->alpha0_endpoint_index = (uint16)uVar11;
        }
        else {
          uVar11 = (uint)pbVar12->alpha0_endpoint_index;
        }
        bVar14 = (bool)(bVar14 & uVar13 < output_width);
        uVar4 = symbol_codec::decode(this_00,this->m_selector_delta_dm + 1);
        if (bVar14) {
          puVar2 = (this->m_alpha_selectors).m_p;
          *(uint *)(local_98 + lVar9) =
               CONCAT22(puVar2[uVar4 * 3],(this->m_alpha_endpoints).m_p[uVar11]);
          *(undefined4 *)(local_98 + lVar9 + 4) = *(undefined4 *)(puVar2 + (ulong)(uVar4 * 3) + 1);
        }
        uVar13 = uVar13 + 1;
        uVar5 = uVar5 + 1;
      }
      local_98 = local_98 + lVar9 + (long)(int)((row_pitch_in_bytes >> 2) + new_size * -2) * 4;
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

bool unpack_dxt5a(uint8** pDst, uint32 row_pitch_in_bytes, uint32 output_width, uint32 output_height)
        {
            const uint32 num_alpha_endpoints = m_alpha_endpoints.size();
            const uint32 width = (output_width + 1) & ~1;
            const uint32 height = (output_height + 1) & ~1;
            const int32 delta_pitch_in_dwords = (row_pitch_in_bytes >> 2) - (width << 1);

            if (m_block_buffer.size() < width)
                m_block_buffer.resize(width);

            uint32 alpha0_endpoint_index = 0;
            uint8 reference_group = 0;

            for (uint32 f = 0; f < m_pHeader->m_faces; f++)
            {
                uint32* pData = (uint32*)pDst[f];
                for (uint32 y = 0; y < height; y++, pData += delta_pitch_in_dwords)
                {
                    bool visible = y < output_height;
                    for (uint32 x = 0; x < width; x++, pData += 2)
                    {
                        visible = visible && x < output_width;
                        if (!(y & 1) && !(x & 1))
                            reference_group = m_codec.decode(m_reference_encoding_dm);
                        block_buffer_element& buffer = m_block_buffer[x];
                        uint8 endpoint_reference;
                        if (y & 1)
                        {
                            endpoint_reference = buffer.endpoint_reference;
                        }
                        else
                        {
                            endpoint_reference = reference_group & 3;
                            reference_group >>= 2;
                            buffer.endpoint_reference = reference_group & 3;
                            reference_group >>= 2;
                        }
                        if (!endpoint_reference)
                        {
                            alpha0_endpoint_index += m_codec.decode(m_endpoint_delta_dm[1]);
                            if (alpha0_endpoint_index >= num_alpha_endpoints)
                                alpha0_endpoint_index -= num_alpha_endpoints;
                            buffer.alpha0_endpoint_index = alpha0_endpoint_index;
                        }
                        else if (endpoint_reference == 1)
                        {
                            buffer.alpha0_endpoint_index = alpha0_endpoint_index;
                        }
                        else
                        {
                            alpha0_endpoint_index = buffer.alpha0_endpoint_index;
                        }
                        uint32 alpha0_selector_index = m_codec.decode(m_selector_delta_dm[1]);
                        if (visible)
                        {
                            const uint16* pAlpha0_selectors = &m_alpha_selectors[alpha0_selector_index * 3];
                            pData[0] = m_alpha_endpoints[alpha0_endpoint_index] | (pAlpha0_selectors[0] << 16);
                            pData[1] = pAlpha0_selectors[1] | (pAlpha0_selectors[2] << 16);
                        }
                    }
                }
            }
            return true;
        }